

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackNuGetGenerator.cxx
# Opt level: O0

void __thiscall cmCPackNuGetGenerator::AddGeneratedPackageNames(cmCPackNuGetGenerator *this)

{
  cmCPackLog *this_00;
  bool bVar1;
  ostream *this_01;
  char *msg;
  value_type local_248;
  value_type local_228;
  long local_208;
  size_type pos2;
  size_type pos1;
  string *psStack_1f0;
  char sep;
  string *fileNames;
  ostringstream local_1c8 [8];
  ostringstream cmCPackLog_msg;
  allocator<char> local_39;
  string local_38;
  cmValue local_18;
  cmValue files_list;
  cmCPackNuGetGenerator *this_local;
  
  files_list.Value = (string *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"GEN_CPACK_OUTPUT_FILES",&local_39);
  local_18 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  bVar1 = cmValue::operator_cast_to_bool(&local_18);
  if (bVar1) {
    psStack_1f0 = cmValue::operator*[abi_cxx11_(&local_18);
    pos1._7_1_ = 0x3b;
    pos2 = 0;
    local_208 = std::__cxx11::string::find((char)psStack_1f0,0x3b);
    while (local_208 != -1) {
      std::__cxx11::string::substr((ulong)&local_228,(ulong)psStack_1f0);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&(this->super_cmCPackGenerator).packageFileNames,&local_228);
      std::__cxx11::string::~string((string *)&local_228);
      pos2 = local_208 + 1;
      local_208 = std::__cxx11::string::find((char)psStack_1f0,0x3b);
    }
    std::__cxx11::string::substr((ulong)&local_248,(ulong)psStack_1f0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&(this->super_cmCPackGenerator).packageFileNames,&local_248);
    std::__cxx11::string::~string((string *)&local_248);
  }
  else {
    std::__cxx11::ostringstream::ostringstream(local_1c8);
    this_01 = std::operator<<((ostream *)local_1c8,
                              "Error while execution CPackNuGet.cmake: No NuGet package has generated"
                             );
    std::ostream::operator<<(this_01,std::endl<char,std::char_traits<char>>);
    this_00 = (this->super_cmCPackGenerator).Logger;
    std::__cxx11::ostringstream::str();
    msg = (char *)std::__cxx11::string::c_str();
    cmCPackLog::Log(this_00,0x10,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CPack/cmCPackNuGetGenerator.cxx"
                    ,0x80,msg);
    std::__cxx11::string::~string((string *)&fileNames);
    std::__cxx11::ostringstream::~ostringstream(local_1c8);
  }
  return;
}

Assistant:

void cmCPackNuGetGenerator::AddGeneratedPackageNames()
{
  cmValue const files_list = this->GetOption("GEN_CPACK_OUTPUT_FILES");
  if (!files_list) {
    cmCPackLogger(
      cmCPackLog::LOG_ERROR,
      "Error while execution CPackNuGet.cmake: No NuGet package has generated"
        << std::endl);
    return;
  }
  // add the generated packages to package file names list
  const std::string& fileNames = *files_list;
  const char sep = ';';
  std::string::size_type pos1 = 0;
  std::string::size_type pos2 = fileNames.find(sep, pos1 + 1);
  while (pos2 != std::string::npos) {
    this->packageFileNames.push_back(fileNames.substr(pos1, pos2 - pos1));
    pos1 = pos2 + 1;
    pos2 = fileNames.find(sep, pos1 + 1);
  }
  this->packageFileNames.push_back(fileNames.substr(pos1, pos2 - pos1));
}